

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_encode_chunks(spng_ctx *ctx)

{
  spng__decode_plte *data_00;
  spng_splt *__s;
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  spng_state sVar4;
  uint uVar5;
  spng_splt *psVar6;
  spng_text2 *psVar7;
  char *__s_00;
  uint8_t uVar8;
  uint8_t uVar9;
  spng_text2 *psVar10;
  short sVar11;
  int iVar12;
  spng_chunk_bitfield sVar13;
  uint uVar14;
  Bytef *pBVar15;
  spng__decode_plte *psVar16;
  size_t sVar17;
  uLongf uVar18;
  ulong uVar19;
  size_t sVar20;
  uint8_t *puVar21;
  ulong uVar22;
  long lVar23;
  uint8_t uVar24;
  size_t chunk_length;
  ulong uVar26;
  ulong uVar27;
  size_t sVar28;
  uchar *data;
  size_t sStack_b0;
  uLongf dest_len;
  undefined4 local_98;
  ulong local_90;
  Bytef *local_88;
  spng_text2 *local_80;
  ulong local_78;
  size_t local_70;
  size_t local_68;
  ulong local_60;
  uchar *cdata;
  z_stream *local_50;
  ulong local_48;
  ulong local_40;
  spng__zlib_options *local_38;
  uint16_t uVar25;
  
  if (ctx == (spng_ctx *)0x0) {
    return 1;
  }
  sVar4 = ctx->state;
  if (sVar4 == SPNG_STATE_INVALID) {
    return 0x46;
  }
  if (sVar4 == SPNG_STATE_INIT) {
    return 0x53;
  }
  if ((ctx->field_0xcc & 0x10) == 0) {
    return 0x51;
  }
  if (sVar4 < SPNG_STATE_FIRST_IDAT) {
    if (((uint)ctx->stored & 1) == 0) {
      return 0xf;
    }
    iVar12 = write_data(ctx,spng_signature,8);
    if (iVar12 == 0) {
      data_00 = &ctx->decode_plte;
      uVar14 = (ctx->ihdr).width;
      uVar5 = (ctx->ihdr).height;
      (ctx->decode_plte).align_this =
           uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
      (ctx->decode_plte).rgba[1] =
           (spng_plte_entry)
           (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
      uVar24 = (ctx->ihdr).color_type;
      uVar8 = (ctx->ihdr).compression_method;
      uVar9 = (ctx->ihdr).filter_method;
      *(uint8_t *)((long)&ctx->decode_plte + 8) = (ctx->ihdr).bit_depth;
      *(uint8_t *)((long)&ctx->decode_plte + 9) = uVar24;
      *(uint8_t *)((long)&ctx->decode_plte + 10) = uVar8;
      *(uint8_t *)((long)&ctx->decode_plte + 0xb) = uVar9;
      (ctx->decode_plte).rgba[3].red = (ctx->ihdr).interlace_method;
      iVar12 = write_chunk(ctx,"IHDR",data_00,0xd);
      if (iVar12 != 0) goto switchD_00106984_caseD_1;
      sVar13 = ctx->stored;
      if (((uint)sVar13 & 4) != 0) {
        uVar14 = (ctx->chrm_int).white_point_x;
        uVar5 = (ctx->chrm_int).white_point_y;
        (ctx->decode_plte).align_this =
             uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
        (ctx->decode_plte).rgba[1] =
             (spng_plte_entry)
             (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
        uVar14 = (ctx->chrm_int).red_x;
        (ctx->decode_plte).rgba[2] =
             (spng_plte_entry)
             (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
        uVar14 = (ctx->chrm_int).red_y;
        (ctx->decode_plte).rgba[3] =
             (spng_plte_entry)
             (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
        uVar14 = (ctx->chrm_int).green_x;
        (ctx->decode_plte).rgba[4] =
             (spng_plte_entry)
             (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
        uVar14 = (ctx->chrm_int).green_y;
        (ctx->decode_plte).rgba[5] =
             (spng_plte_entry)
             (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
        uVar14 = (ctx->chrm_int).blue_x;
        (ctx->decode_plte).rgba[6] =
             (spng_plte_entry)
             (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
        uVar14 = (ctx->chrm_int).blue_y;
        (ctx->decode_plte).rgba[7] =
             (spng_plte_entry)
             (uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18);
        iVar12 = write_chunk(ctx,"cHRM",data_00,0x20);
        if (iVar12 != 0) goto switchD_00106984_caseD_1;
        sVar13 = ctx->stored;
      }
      if (((uint)sVar13 & 0x10) != 0) {
        uVar14 = ctx->gama;
        (ctx->decode_plte).align_this =
             uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
        iVar12 = write_chunk(ctx,"gAMA",data_00,4);
        if (iVar12 != 0) goto switchD_00106984_caseD_1;
        sVar13 = ctx->stored;
      }
      if (((uint)sVar13 & 8) != 0) {
        dest_len = compressBound((ctx->iccp).profile_len);
        pBVar15 = (Bytef *)(*(ctx->alloc).malloc_fn)(dest_len);
        if (pBVar15 == (Bytef *)0x0) {
LAB_00107417:
          iVar12 = 2;
        }
        else {
          iVar12 = compress2(pBVar15,&dest_len,(ctx->iccp).profile,(ctx->iccp).profile_len,
                             0xffffffffffffffff);
          if (iVar12 == 0) {
            sVar28 = strlen((ctx->iccp).profile_name);
            if (CARRY8(sVar28 + 2,dest_len)) {
LAB_00106a1b:
              iVar12 = 3;
            }
            else {
              cdata = (uchar *)0x0;
              iVar12 = write_header(ctx,"iCCP",sVar28 + 2 + dest_len,&cdata);
              if (iVar12 == 0) {
                memcpy(cdata,&ctx->iccp,sVar28 + 1);
                cdata[sVar28 + 1] = '\0';
                memcpy(cdata + sVar28 + 2,pBVar15,dest_len);
                (*(ctx->alloc).free_fn)(pBVar15);
                iVar12 = finish_chunk(ctx);
                if (iVar12 == 0) {
                  sVar13 = ctx->stored;
                  goto LAB_0010695a;
                }
              }
              else {
                (*(ctx->alloc).free_fn)(pBVar15);
              }
            }
          }
          else {
LAB_001069f4:
            (*(ctx->alloc).free_fn)(pBVar15);
            iVar12 = 0x40;
          }
        }
        goto switchD_00106984_caseD_1;
      }
LAB_0010695a:
      if (((uint)sVar13 & 0x20) != 0) {
        iVar12 = 0x50;
        switch((ctx->ihdr).color_type) {
        case '\0':
          sVar20 = 1;
          (ctx->decode_plte).rgba[0].red = (ctx->sbit).grayscale_bits;
          break;
        default:
          goto switchD_00106984_caseD_1;
        case '\x02':
        case '\x03':
          (ctx->decode_plte).rgba[0].red = (ctx->sbit).red_bits;
          *(undefined2 *)((long)&ctx->decode_plte + 1) = *(undefined2 *)&(ctx->sbit).green_bits;
          sVar20 = 3;
          break;
        case '\x04':
          sVar20 = 2;
          uVar24 = (ctx->sbit).alpha_bits;
          (ctx->decode_plte).rgba[0].red = (ctx->sbit).grayscale_bits;
          (ctx->decode_plte).rgba[0].green = uVar24;
          break;
        case '\x06':
          sVar20 = 4;
          uVar24 = (ctx->sbit).green_bits;
          uVar8 = (ctx->sbit).blue_bits;
          uVar9 = (ctx->sbit).alpha_bits;
          *(uint8_t *)&ctx->decode_plte = (ctx->sbit).red_bits;
          *(uint8_t *)((long)&ctx->decode_plte + 1) = uVar24;
          *(uint8_t *)((long)&ctx->decode_plte + 2) = uVar8;
          *(uint8_t *)((long)&ctx->decode_plte + 3) = uVar9;
        }
        iVar12 = write_chunk(ctx,"sBIT",data_00,sVar20);
        if (iVar12 != 0) goto switchD_00106984_caseD_1;
        sVar13 = ctx->stored;
      }
      if (((((uint)sVar13 & 0x40) != 0) &&
          (iVar12 = write_chunk(ctx,"sRGB",&ctx->srgb_rendering_intent,1), iVar12 != 0)) ||
         (iVar12 = write_unknown_chunks(ctx,SPNG_AFTER_IHDR), iVar12 != 0))
      goto switchD_00106984_caseD_1;
      sVar13 = ctx->stored;
      if (((uint)sVar13 & 2) != 0) {
        uVar14 = (ctx->plte).n_entries;
        puVar21 = &(ctx->plte).entries[0].blue;
        for (uVar27 = 0; (ulong)uVar14 * 3 != uVar27; uVar27 = uVar27 + 3) {
          data_00->rgb[uVar27 & 0xffffffff] = ((spng_plte_entry *)(puVar21 + -2))->red;
          data_00->rgb[(int)uVar27 + 1] = puVar21[-1];
          data_00->rgb[(int)uVar27 + 2] = *puVar21;
          puVar21 = puVar21 + 4;
        }
        iVar12 = write_chunk(ctx,"PLTE",data_00,(ulong)(uVar14 * 3));
        if (iVar12 != 0) goto switchD_00106984_caseD_1;
        sVar13 = ctx->stored;
      }
      if (((uint)sVar13 >> 8 & 1) != 0) {
        iVar12 = 0x50;
        switch((ctx->ihdr).color_type) {
        case '\0':
        case '\x04':
          psVar16 = (spng__decode_plte *)((long)&ctx->decode_plte + 1);
          uVar25 = (ctx->bkgd).gray;
          (ctx->decode_plte).rgba[0].red = (uint8_t)(uVar25 >> 8);
          sStack_b0 = 2;
          break;
        default:
          goto switchD_00106984_caseD_1;
        case '\x02':
        case '\x06':
          psVar16 = (spng__decode_plte *)((long)&ctx->decode_plte + 5);
          uVar2 = (ctx->bkgd).red;
          uVar3 = (ctx->bkgd).green;
          *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
          *(ushort *)((long)&ctx->decode_plte + 2) = uVar3 << 8 | uVar3 >> 8;
          uVar25 = (ctx->bkgd).blue;
          (ctx->decode_plte).rgba[1].red = (uint8_t)(uVar25 >> 8);
          sStack_b0 = 6;
          break;
        case '\x03':
          uVar24 = (uint8_t)(ctx->bkgd).plte_index;
          sStack_b0 = 1;
          psVar16 = data_00;
          goto LAB_00106c37;
        }
        uVar24 = (uint8_t)uVar25;
LAB_00106c37:
        psVar16->rgba[0].red = uVar24;
        iVar12 = write_chunk(ctx,"bKGD",data_00,sStack_b0);
        if (iVar12 != 0) goto switchD_00106984_caseD_1;
        sVar13 = ctx->stored;
      }
      if (((uint)sVar13 >> 9 & 1) != 0) {
        uVar14 = (ctx->plte).n_entries;
        for (uVar27 = 0; (ulong)uVar14 * 2 != uVar27; uVar27 = uVar27 + 2) {
          uVar2 = *(ushort *)((long)(ctx->hist).frequency + uVar27);
          *(ushort *)(ctx->trns_px + (uVar27 & 0xffffffff) + 8) = uVar2 << 8 | uVar2 >> 8;
        }
        iVar12 = write_chunk(ctx,"hIST",data_00,(ulong)(uVar14 * 2));
        if (iVar12 != 0) goto switchD_00106984_caseD_1;
        sVar13 = ctx->stored;
      }
      if (((uint)sVar13 >> 10 & 1) != 0) {
        uVar24 = (ctx->ihdr).color_type;
        if (uVar24 == '\x03') {
          sStack_b0 = (size_t)(ctx->trns).n_type3_entries;
          psVar16 = (spng__decode_plte *)(ctx->trns).type3_alpha;
        }
        else {
          psVar16 = data_00;
          if (uVar24 == '\x02') {
            uVar2 = (ctx->trns).red;
            uVar3 = (ctx->trns).green;
            *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
            *(ushort *)((long)&ctx->decode_plte + 2) = uVar3 << 8 | uVar3 >> 8;
            uVar2 = (ctx->trns).blue;
            *(ushort *)((long)&ctx->decode_plte + 4) = uVar2 << 8 | uVar2 >> 8;
            sStack_b0 = 6;
          }
          else {
            if (uVar24 != '\0') goto LAB_00106d7e;
            uVar2 = (ctx->trns).gray;
            *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
            sStack_b0 = 2;
          }
        }
        iVar12 = write_chunk(ctx,"tRNS",psVar16,sStack_b0);
        if (iVar12 != 0) goto switchD_00106984_caseD_1;
        sVar13 = ctx->stored;
      }
LAB_00106d7e:
      if (((uint)sVar13 >> 0xb & 1) != 0) {
        uVar14 = (ctx->phys).ppu_x;
        uVar5 = (ctx->phys).ppu_y;
        (ctx->decode_plte).align_this =
             uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
        (ctx->decode_plte).rgba[1] =
             (spng_plte_entry)
             (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
        (ctx->decode_plte).rgba[2].red = (ctx->phys).unit_specifier;
        iVar12 = write_chunk(ctx,"pHYs",data_00,9);
        if (iVar12 != 0) goto switchD_00106984_caseD_1;
        sVar13 = ctx->stored;
      }
      if (((uint)sVar13 >> 0xc & 1) == 0) {
LAB_00106fe3:
        if (((uint)sVar13 >> 0xd & 1) != 0) {
          uVar2 = (ctx->time).year;
          *(ushort *)&ctx->decode_plte = uVar2 << 8 | uVar2 >> 8;
          *(undefined4 *)((long)&ctx->decode_plte + 2) = *(undefined4 *)&(ctx->time).month;
          (ctx->decode_plte).rgba[1].blue = (ctx->time).second;
          iVar12 = write_chunk(ctx,"tIME",data_00,7);
          if (iVar12 != 0) goto switchD_00106984_caseD_1;
          sVar13 = ctx->stored;
        }
        if (sVar13._0_1_ < '\0') {
          dest_len = 0;
          local_38 = &ctx->text_options;
          local_50 = &ctx->zstream;
          local_90 = 0x30;
          local_40 = 0xffffffffffffffff;
          do {
            uVar27 = local_90;
            local_40 = local_40 + 1;
            if (ctx->n_text <= local_40) {
              sVar13 = ctx->stored;
              goto LAB_0010703e;
            }
            psVar7 = ctx->text_list;
            iVar12 = *(int *)(psVar7->user_keyword_storage + (local_90 - 0x70));
            local_88 = (Bytef *)strlen(*(char **)(psVar7->user_keyword_storage + (local_90 - 0x68)))
            ;
            local_80 = psVar7;
            local_78 = strlen(*(char **)(psVar7->user_keyword_storage + (uVar27 - 0x60)));
            local_60 = (long)local_88 + 1;
            puVar21 = *(uint8_t **)(&DAT_0010fdd0 + (long)iVar12 * 8);
            if ((long)iVar12 == 3) {
              iVar12 = 0x50;
              if ((*(char **)(local_80->user_keyword_storage + (local_90 - 0x48)) == (char *)0x0) ||
                 (__s_00 = *(char **)(local_80->user_keyword_storage + (local_90 - 0x40)),
                 __s_00 == (char *)0x0)) break;
              local_68 = strlen(*(char **)(local_80->user_keyword_storage + (local_90 - 0x48)));
              uVar27 = local_68 + local_60;
              if (CARRY8(local_68,local_60)) goto LAB_00106a1b;
              local_70 = strlen(__s_00);
              uVar19 = uVar27 + local_70;
              if ((CARRY8(uVar27,local_70)) || (0xfffffffffffffffb < uVar19)) goto LAB_00106a1b;
              uVar19 = uVar19 + 4;
            }
            else {
              uVar19 = local_60;
              if (iVar12 == 2) {
                uVar19 = (long)local_88 + 2;
              }
              local_68 = 0;
              local_70 = 0;
            }
            if (local_80->user_keyword_storage[local_90 - 0x50] == '\0') {
              local_88 = (Bytef *)0x0;
              local_48 = 0;
              uVar27 = local_78;
            }
            else {
              iVar12 = spng__deflate_init(ctx,local_38);
              if (iVar12 != 0) break;
              sVar20 = deflateBound(local_50,local_78);
              local_88 = (Bytef *)(*(ctx->alloc).malloc_fn)(sVar20);
              if (local_88 == (Bytef *)0x0) goto LAB_00107417;
              (ctx->zstream).next_in =
                   *(Bytef **)(local_80->user_keyword_storage + (local_90 - 0x60));
              (ctx->zstream).avail_in = (uInt)local_78;
              (ctx->zstream).next_out = local_88;
              (ctx->zstream).avail_out = (uInt)sVar20;
              iVar12 = deflate(local_50,4);
              pBVar15 = local_88;
              if (iVar12 != 1) goto LAB_001069f4;
              local_48 = (ctx->zstream).total_out;
              uVar27 = local_48;
            }
            if (CARRY8(uVar19,uVar27)) goto LAB_00106a1b;
            iVar12 = write_header(ctx,puVar21,uVar19 + uVar27,(uchar **)&dest_len);
            uVar19 = local_60;
            psVar7 = local_80;
            uVar27 = local_90;
            if (iVar12 != 0) {
              (*(ctx->alloc).free_fn)(local_88);
              break;
            }
            memcpy((void *)dest_len,*(void **)(local_80->user_keyword_storage + (local_90 - 0x68)),
                   local_60);
            psVar10 = local_80;
            uVar22 = local_90;
            dest_len = uVar19 + dest_len;
            if (*(int *)(psVar7->user_keyword_storage + (uVar27 - 0x70)) == 2) {
              *(char *)dest_len = '\0';
              dest_len = dest_len + 1;
            }
            else if (*(int *)(psVar7->user_keyword_storage + (uVar27 - 0x70)) == 3) {
              *(char *)dest_len = local_80->user_keyword_storage[local_90 - 0x50];
              *(char *)(dest_len + 1) = '\0';
              dest_len = dest_len + 2;
              sVar28 = local_68 + 1;
              memcpy((void *)dest_len,*(void **)(local_80->user_keyword_storage + (local_90 - 0x48))
                     ,sVar28);
              dest_len = sVar28 + dest_len;
              sVar28 = local_70 + 1;
              memcpy((void *)dest_len,*(void **)(psVar10->user_keyword_storage + (uVar22 - 0x40)),
                     sVar28);
              dest_len = sVar28 + dest_len;
            }
            uVar27 = local_48;
            pBVar15 = local_88;
            if (local_80->user_keyword_storage[local_90 - 0x50] == '\0') {
              uVar27 = local_78;
              pBVar15 = *(Bytef **)(local_80->user_keyword_storage + (local_90 - 0x60));
            }
            memcpy((void *)dest_len,pBVar15,uVar27);
            local_90 = local_90 + 0x90;
            (*(ctx->alloc).free_fn)(local_88);
            iVar12 = finish_chunk(ctx);
          } while (iVar12 == 0);
        }
        else {
LAB_0010703e:
          sVar11 = sVar13._0_2_;
          if (((uint)sVar13 >> 0xe & 1) != 0) {
            uVar14 = (ctx->offs).x;
            uVar5 = (ctx->offs).y;
            (ctx->decode_plte).align_this =
                 uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18
            ;
            (ctx->decode_plte).rgba[1] =
                 (spng_plte_entry)
                 (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18);
            (ctx->decode_plte).rgba[2].red = (ctx->offs).unit_specifier;
            iVar12 = write_chunk(ctx,"oFFs",data_00,9);
            if (iVar12 != 0) goto switchD_00106984_caseD_1;
            sVar11 = SUB42(ctx->stored,0);
          }
          if (((-1 < sVar11) ||
              (iVar12 = write_chunk(ctx,"eXIf",(ctx->exif).data,(ctx->exif).length), iVar12 == 0))
             && (iVar12 = write_unknown_chunks(ctx,SPNG_AFTER_PLTE), iVar12 == 0)) {
            sVar4 = SPNG_STATE_FIRST_IDAT;
            goto LAB_001067f6;
          }
        }
      }
      else {
        dest_len = 0;
        uVar27 = 0;
        do {
          if (ctx->n_splt <= uVar27) {
            sVar13 = ctx->stored;
            goto LAB_00106fe3;
          }
          psVar6 = ctx->splt_list;
          __s = psVar6 + uVar27;
          local_90 = uVar27;
          sVar17 = strlen(__s->name);
          sVar28 = sVar17 + 1;
          uVar24 = psVar6[uVar27].sample_depth;
          iVar12 = 6;
          if (uVar24 == '\b') {
LAB_00106e33:
            chunk_length = sVar28 + iVar12 * __s->n_entries + 1;
          }
          else {
            chunk_length = sVar28;
            if (uVar24 == '\x10') {
              iVar12 = 10;
              goto LAB_00106e33;
            }
          }
          iVar12 = write_header(ctx,"sPLT",chunk_length,(uchar **)&dest_len);
          if (iVar12 != 0) break;
          memcpy((void *)dest_len,__s,sVar28);
          uVar27 = local_90;
          lVar1 = dest_len + sVar17;
          uVar18 = lVar1 + 2;
          uVar24 = __s->sample_depth;
          *(uint8_t *)(dest_len + 1 + sVar17) = uVar24;
          if (uVar24 == '\b') {
            uVar14 = 3;
            lVar23 = 0;
            for (uVar19 = 0; uVar19 < __s->n_entries; uVar19 = uVar19 + 1) {
              *(undefined1 *)(uVar18 + (uVar14 - 3)) =
                   *(undefined1 *)((long)&__s->entries->red + lVar23);
              *(undefined1 *)(uVar18 + (uVar14 - 2)) =
                   *(undefined1 *)((long)&__s->entries->green + lVar23);
              *(undefined1 *)(uVar18 + (uVar14 - 1)) =
                   *(undefined1 *)((long)&__s->entries->blue + lVar23);
              *(undefined1 *)(uVar18 + uVar14) =
                   *(undefined1 *)((long)&__s->entries->alpha + lVar23);
              uVar2 = *(ushort *)((long)&__s->entries->frequency + lVar23);
              *(ushort *)(lVar1 + 6 + (ulong)(uVar14 - 3)) = uVar2 << 8 | uVar2 >> 8;
              lVar23 = lVar23 + 10;
              uVar14 = uVar14 + 6;
            }
          }
          else if (uVar24 == '\x10') {
            uVar19 = 0;
            for (uVar22 = 0; uVar22 < __s->n_entries; uVar22 = uVar22 + 1) {
              uVar2 = *(ushort *)((long)&__s->entries->red + uVar19);
              uVar26 = uVar19 & 0xffffffff;
              *(ushort *)(uVar18 + uVar26) = uVar2 << 8 | uVar2 >> 8;
              uVar2 = *(ushort *)((long)&__s->entries->green + uVar19);
              *(ushort *)(lVar1 + 4 + uVar26) = uVar2 << 8 | uVar2 >> 8;
              uVar2 = *(ushort *)((long)&__s->entries->blue + uVar19);
              *(ushort *)(lVar1 + 6 + uVar26) = uVar2 << 8 | uVar2 >> 8;
              uVar2 = *(ushort *)((long)&__s->entries->alpha + uVar19);
              *(ushort *)(lVar1 + 8 + uVar26) = uVar2 << 8 | uVar2 >> 8;
              uVar2 = *(ushort *)((long)&__s->entries->frequency + uVar19);
              *(ushort *)(lVar1 + 10 + uVar26) = uVar2 << 8 | uVar2 >> 8;
              uVar19 = uVar19 + 10;
            }
          }
          dest_len = uVar18;
          iVar12 = finish_chunk(ctx);
          uVar27 = uVar27 + 1;
        } while (iVar12 == 0);
      }
    }
switchD_00106984_caseD_1:
    ctx->state = SPNG_STATE_INVALID;
  }
  else {
    if (sVar4 != SPNG_STATE_FIRST_IDAT) {
      if (sVar4 != SPNG_STATE_EOI) {
        return 0x54;
      }
      iVar12 = write_unknown_chunks(ctx,SPNG_AFTER_IDAT);
      if (iVar12 != 0) goto switchD_00106984_caseD_1;
      dest_len = 0x444e454900000000;
      local_98 = 0x826042ae;
      iVar12 = write_data(ctx,&dest_len,0xc);
      if (iVar12 != 0) goto switchD_00106984_caseD_1;
      sVar4 = SPNG_STATE_IEND;
LAB_001067f6:
      ctx->state = sVar4;
    }
    iVar12 = 0;
  }
  return iVar12;
}

Assistant:

int spng_encode_chunks(spng_ctx *ctx)
{
    if(ctx == NULL) return 1;
    if(!ctx->state) return SPNG_EBADSTATE;
    if(ctx->state < SPNG_STATE_OUTPUT) return SPNG_ENODST;
    if(!ctx->encode_only) return SPNG_ECTXTYPE;

    int ret = 0;

    if(ctx->state < SPNG_STATE_FIRST_IDAT)
    {
        if(!ctx->stored.ihdr) return SPNG_ENOIHDR;

        ret = write_chunks_before_idat(ctx);
        if(ret) return encode_err(ctx, ret);

        ctx->state = SPNG_STATE_FIRST_IDAT;
    }
    else if(ctx->state == SPNG_STATE_FIRST_IDAT)
    {
        return 0;
    }
    else if(ctx->state == SPNG_STATE_EOI)
    {
        ret = write_chunks_after_idat(ctx);
        if(ret) return encode_err(ctx, ret);

        ctx->state = SPNG_STATE_IEND;
    }
    else return SPNG_EOPSTATE;

    return 0;
}